

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O2

bool duckdb::PipelineExceedsThreadCount(Pipeline *pipeline,idx_t thread_count)

{
  PhysicalOperator *this;
  idx_t iVar1;
  optional_ptr<duckdb::PhysicalOperator,_true> local_10;
  
  local_10.ptr = (pipeline->source).ptr;
  this = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_10);
  iVar1 = PhysicalOperator::EstimatedThreadCount(this);
  return thread_count < iVar1;
}

Assistant:

static bool PipelineExceedsThreadCount(Pipeline &pipeline, const idx_t thread_count) {
#ifdef DEBUG
	// we always add the dependency in debug mode so that this is well-tested
	return true;
#else
	return pipeline.GetSource()->EstimatedThreadCount() > thread_count;
#endif
}